

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O0

string * __thiscall
netlist::NetlistVariableReference::toString_abi_cxx11_(NetlistVariableReference *this)

{
  int32_t iVar1;
  int32_t iVar2;
  NetlistNode *in_RSI;
  string *in_RDI;
  undefined1 in_stack_00000160 [16];
  undefined1 in_stack_00000170 [16];
  string_view local_e8;
  char *local_d8;
  undefined8 local_d0;
  undefined1 local_b8 [16];
  undefined4 local_a8 [4];
  undefined4 local_98 [6];
  undefined8 local_80;
  undefined1 *local_78;
  char *local_70;
  undefined8 local_68;
  undefined4 *local_60;
  undefined4 *local_58;
  string_view *local_50;
  char *local_48;
  undefined8 local_40;
  undefined4 local_2c;
  undefined4 *local_28;
  undefined4 local_1c;
  undefined4 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_d8 = "{}[{}:{}]";
  local_d0 = 9;
  local_e8 = NetlistNode::getName(in_RSI);
  iVar1 = slang::ConstantRange::upper((ConstantRange *)0x1879f8);
  iVar2 = slang::ConstantRange::lower((ConstantRange *)0x187a09);
  local_48 = local_d8;
  local_40 = local_d0;
  local_50 = &local_e8;
  local_58 = (undefined4 *)&stack0xffffffffffffff14;
  local_60 = (undefined4 *)&stack0xffffffffffffff10;
  local_70 = local_d8;
  local_68 = local_d0;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
            ((value<fmt::v11::context> *)CONCAT44(iVar1,iVar2),
             (basic_string_view<char,_std::char_traits<char>_> *)in_RDI);
  local_18 = local_a8;
  local_1c = *local_58;
  local_28 = local_98;
  local_2c = *local_60;
  local_8 = &local_80;
  local_10 = local_b8;
  local_80 = 0x11d;
  local_a8[0] = local_1c;
  local_98[0] = local_2c;
  local_78 = local_10;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000170,(format_args)in_stack_00000160);
  return in_RDI;
}

Assistant:

std::string toString() const {
        return fmt::format("{}[{}:{}]", getName(), bounds.upper(), bounds.lower());
    }